

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness.c
# Opt level: O2

char * retrieveLOName(Abc_Ntk_t *pNtkOld,Aig_Man_t *pAigOld,Aig_Man_t *pAigNew,Aig_Obj_t *pObjPivot,
                     Vec_Ptr_t *vLive,Vec_Ptr_t *vFair)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  Aig_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  char *pcVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  
  iVar9 = pAigOld->nRegs;
  pcVar4 = (char *)malloc(0x32);
  iVar2 = Saig_ObjIsLo(pAigNew,pObjPivot);
  if (iVar2 == 0) {
    __assert_fail("Saig_ObjIsLo( pAigNew, pObjPivot )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/liveness.c"
                  ,0x90,
                  "char *retrieveLOName(Abc_Ntk_t *, Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                 );
  }
  iVar2 = 0;
  while ((iVar2 < pAigNew->nRegs &&
         (pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pAigNew->vCis,pAigNew->nTruePis + iVar2),
         pAVar5 != pObjPivot))) {
    iVar2 = iVar2 + 1;
  }
  if (iVar2 < iVar9) {
    iVar2 = iVar2 + pAigOld->nTruePis;
    pAVar5 = Aig_ManCi(pAigOld,iVar2);
    pAVar6 = Abc_NtkCi(pNtkOld,iVar2);
    if ((Aig_Obj_t *)(pAVar5->field_5).pData != pObjPivot) {
      __assert_fail("pObjOld->pData == pObjPivot",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/liveness.c"
                    ,0x99,
                    "char *retrieveLOName(Abc_Ntk_t *, Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                   );
    }
    pcVar4 = Abc_ObjName(pAVar6);
    return pcVar4;
  }
  if (iVar2 == iVar9) {
    pcVar7 = "SAVED_LO";
  }
  else {
    iVar1 = iVar9 * 2;
    if ((iVar2 == iVar1 || SBORROW4(iVar2,iVar1) != iVar2 + iVar9 * -2 < 0) &&
        (iVar2 != iVar9 && iVar9 <= iVar2)) {
      iVar9 = (pAigOld->nTruePis - iVar9) + iVar2 + -1;
      Aig_ManCi(pAigOld,iVar9);
      pAVar6 = Abc_NtkCi(pNtkOld,iVar9);
      pcVar7 = Abc_ObjName(pAVar6);
      sprintf(pcVar4,"%s__%s",pcVar7,"SHADOW");
      pcVar7 = pcVar4;
    }
    else {
      iVar10 = vLive->nSize;
      iVar8 = iVar10 + iVar1 + 1;
      if (iVar2 < iVar8 && (iVar2 != iVar1 && SBORROW4(iVar2,iVar1) == iVar2 + iVar9 * -2 < 0)) {
        *pcVar4 = '\0';
        iVar10 = 0;
        iVar9 = 0;
        do {
          if (pAigOld->nTruePos <= iVar9) {
LAB_00504424:
            __assert_fail("dummyStr[0] != \'\\0\'",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/liveness.c"
                          ,0xbb,
                          "char *retrieveLOName(Abc_Ntk_t *, Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                         );
          }
          Vec_PtrEntry(pAigOld->vCos,iVar9);
          pAVar6 = Abc_NtkPo(pNtkOld,iVar9);
          iVar8 = nodeName_starts_with(pAVar6,"assert_fair");
          if (iVar8 != 0) {
            if (iVar1 + 1 + iVar10 == iVar2) {
              pcVar7 = Abc_ObjName(pAVar6);
              sprintf(pcVar4,"%s__%s",pcVar7,"LIVENESS");
              if (*pcVar4 != '\0') {
                return pcVar4;
              }
              goto LAB_00504424;
            }
            iVar10 = iVar10 + 1;
          }
          iVar9 = iVar9 + 1;
        } while( true );
      }
      pcVar7 = "UNKNOWN";
      if ((iVar8 <= iVar2) && (iVar2 < iVar8 + vFair->nSize)) {
        *pcVar4 = '\0';
        iVar9 = 0;
        iVar8 = 0;
        do {
          if (pAigOld->nTruePos <= iVar8) {
LAB_00504405:
            __assert_fail("dummyStr[0] != \'\\0\'",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/liveness.c"
                          ,0xd3,
                          "char *retrieveLOName(Abc_Ntk_t *, Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                         );
          }
          Vec_PtrEntry(pAigOld->vCos,iVar8);
          pAVar6 = Abc_NtkPo(pNtkOld,iVar8);
          iVar3 = nodeName_starts_with(pAVar6,"assume_fair");
          if (iVar3 != 0) {
            if (iVar10 + iVar9 + iVar1 + 1 == iVar2) {
              pcVar7 = Abc_ObjName(pAVar6);
              sprintf(pcVar4,"%s__%s",pcVar7,"FAIRNESS");
              if (*pcVar4 != '\0') {
                return pcVar4;
              }
              goto LAB_00504405;
            }
            iVar9 = iVar9 + 1;
          }
          iVar8 = iVar8 + 1;
        } while( true );
      }
    }
  }
  return pcVar7;
}

Assistant:

char * retrieveLOName( Abc_Ntk_t *pNtkOld, Aig_Man_t *pAigOld, Aig_Man_t *pAigNew, Aig_Obj_t *pObjPivot, Vec_Ptr_t *vLive, Vec_Ptr_t * vFair )
{
    Aig_Obj_t *pObjOld, *pObj;
    Abc_Obj_t *pNode;
    int index, oldIndex, originalLatchNum = Saig_ManRegNum(pAigOld), strMatch, i;
    char *dummyStr = (char *)malloc( sizeof(char) * 50 );

    assert( Saig_ObjIsLo( pAigNew, pObjPivot ) );
    Saig_ManForEachLo( pAigNew, pObj, index )
        if( pObj == pObjPivot )
            break;
    if( index < originalLatchNum )
    {
        oldIndex = Saig_ManPiNum( pAigOld ) + index;
        pObjOld = Aig_ManCi( pAigOld, oldIndex );
        pNode = Abc_NtkCi( pNtkOld, oldIndex );
        assert( pObjOld->pData == pObjPivot );
        return Abc_ObjName( pNode );
    }
    else if( index == originalLatchNum )
        return "SAVED_LO";
    else if( index > originalLatchNum && index < 2 * originalLatchNum + 1 )
    {
        oldIndex = Saig_ManPiNum( pAigOld ) + index - originalLatchNum - 1;
        pObjOld = Aig_ManCi( pAigOld, oldIndex );
        pNode = Abc_NtkCi( pNtkOld, oldIndex );
        sprintf( dummyStr, "%s__%s", Abc_ObjName( pNode ), "SHADOW");
        return dummyStr;
    }
    else if( index >= 2 * originalLatchNum + 1 && index < 2 * originalLatchNum + 1 + Vec_PtrSize( vLive ) )
    {
        oldIndex = index - 2 * originalLatchNum - 1;
        strMatch = 0;
        dummyStr[0] = '\0';
        Saig_ManForEachPo( pAigOld, pObj, i )
        {
            pNode = Abc_NtkPo( pNtkOld, i );
            //if( strstr( Abc_ObjName( pNode ), "assert_fair" ) != NULL )
            if(    nodeName_starts_with( pNode, "assert_fair" ) )
            {
                if( strMatch == oldIndex )
                {
                    sprintf( dummyStr, "%s__%s", Abc_ObjName( pNode ), "LIVENESS");
                    //return dummyStr;
                    break;
                }
                else
                    strMatch++;
            }
        }
        assert( dummyStr[0] != '\0' );
        return dummyStr;
    }
    else if( index >= 2 * originalLatchNum + 1 + Vec_PtrSize( vLive ) && index < 2 * originalLatchNum + 1 + Vec_PtrSize( vLive ) + Vec_PtrSize( vFair ) )
    {
        oldIndex = index - 2 * originalLatchNum - 1 - Vec_PtrSize( vLive );
        strMatch = 0;
        dummyStr[0] = '\0';
        Saig_ManForEachPo( pAigOld, pObj, i )
        {
            pNode = Abc_NtkPo( pNtkOld, i );
            //if( strstr( Abc_ObjName( pNode ), "assume_fair" ) != NULL )
            if(    nodeName_starts_with( pNode, "assume_fair" ) )
            {
                if( strMatch == oldIndex )
                {
                    sprintf( dummyStr, "%s__%s", Abc_ObjName( pNode ), "FAIRNESS");
                    //return dummyStr;
                    break;
                }
                else
                    strMatch++;
            }
        }
        assert( dummyStr[0] != '\0' );
        return dummyStr;
    }
    else
        return "UNKNOWN";
}